

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

char * tonk::ErrorTypeToString(ErrorType errorType)

{
  ErrorType errorType_local;
  char *local_8;
  
  switch(errorType) {
  case Tonk:
    local_8 = "Tonk";
    break;
  case Siamese:
    local_8 = "Siamese";
    break;
  case Asio:
    local_8 = "Asio";
    break;
  case Cymric:
    local_8 = "Cymric";
    break;
  case LastErr:
    local_8 = "LastErr";
    break;
  case Encrypt:
    local_8 = "Encrypt";
    break;
  case Zstd:
    local_8 = "Zstd";
    break;
  default:
    local_8 = "Unknown";
  }
  return local_8;
}

Assistant:

const char* ErrorTypeToString(ErrorType errorType)
{
    static_assert((int)ErrorType::Count == 7, "Update this");
    switch (errorType)
    {
    case ErrorType::Tonk:    return "Tonk";
    case ErrorType::Siamese: return "Siamese";
    case ErrorType::Asio:    return "Asio";
    case ErrorType::LastErr: return "LastErr";
    case ErrorType::Cymric:  return "Cymric";
    case ErrorType::Encrypt: return "Encrypt";
    case ErrorType::Zstd:    return "Zstd";
    default: break;
    }
    return "Unknown";
}